

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::init_tree(recall_tree *b,uint32_t root,uint32_t depth,uint32_t *routers_used)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  v_array<recall_tree_ns::node> *this;
  node *pnVar4;
  uint32_t *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t right_child;
  uint32_t left_child;
  node *in_stack_fffffffffffffef8;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  if ((ulong)in_EDX <= *(ulong *)(in_RDI + 0x40)) {
    sVar3 = v_array<recall_tree_ns::node>::size((v_array<recall_tree_ns::node> *)(in_RDI + 0x10));
    uVar1 = (uint32_t)sVar3;
    this = (v_array<recall_tree_ns::node> *)(in_RDI + 0x10);
    node::node((node *)0x2a4644);
    v_array<recall_tree_ns::node>::push_back(this,in_stack_fffffffffffffef8);
    sVar3 = v_array<recall_tree_ns::node>::size((v_array<recall_tree_ns::node> *)(in_RDI + 0x10));
    uVar2 = (uint32_t)sVar3;
    node::node((node *)0x2a4689);
    v_array<recall_tree_ns::node>::push_back(this,in_stack_fffffffffffffef8);
    uVar5 = *in_RCX;
    *in_RCX = uVar5 + 1;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    pnVar4->base_router = uVar5;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    pnVar4->internal = true;
    uVar6 = uVar1;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    pnVar4->left = uVar1;
    uVar7 = in_ESI;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)uVar6);
    pnVar4->parent = in_ESI;
    uVar1 = in_EDX;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)uVar6);
    pnVar4->depth = in_EDX;
    uVar5 = uVar2;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)uVar7);
    pnVar4->right = uVar2;
    uVar2 = uVar7;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)uVar5);
    pnVar4->parent = uVar7;
    uVar7 = uVar1;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)uVar5);
    pnVar4->depth = uVar1;
    init_tree((recall_tree *)CONCAT44(uVar2,uVar7),(uint32_t)((ulong)in_RCX >> 0x20),
              (uint32_t)in_RCX,(uint32_t *)CONCAT44(uVar6,uVar5));
    init_tree((recall_tree *)CONCAT44(uVar2,uVar7),(uint32_t)((ulong)in_RCX >> 0x20),
              (uint32_t)in_RCX,(uint32_t *)CONCAT44(uVar6,uVar5));
  }
  return;
}

Assistant:

void init_tree(recall_tree& b, uint32_t root, uint32_t depth, uint32_t& routers_used)
{
  if (depth <= b.max_depth)
  {
    uint32_t left_child;
    uint32_t right_child;
    left_child = (uint32_t)b.nodes.size();
    b.nodes.push_back(node());
    right_child = (uint32_t)b.nodes.size();
    b.nodes.push_back(node());
    b.nodes[root].base_router = routers_used++;

    b.nodes[root].internal = true;
    b.nodes[root].left = left_child;
    b.nodes[left_child].parent = root;
    b.nodes[left_child].depth = depth;
    b.nodes[root].right = right_child;
    b.nodes[right_child].parent = root;
    b.nodes[right_child].depth = depth;

    init_tree(b, left_child, depth + 1, routers_used);
    init_tree(b, right_child, depth + 1, routers_used);
  }
}